

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O0

void test_basic(void)

{
  wchar_t wVar1;
  FILE *__stream;
  size_t sVar2;
  char *pcVar3;
  char local_418 [8];
  char result [1024];
  char *msg;
  FILE *filelist;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                  ,L'u',L'\0');
  __stream = fopen("filelist","w");
  memset(local_418,0,0x400);
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                      ,L'~',"file",L'Ƥ',L'\xffffffff',"1234567890");
  fprintf(__stream,"file\n");
  wVar1 = is_LargeInode("file");
  if (wVar1 != L'\0') {
    sVar2 = strlen(local_418);
    strncat(local_418,"bsdcpio: file: large inode number truncated: ",0x3ff - sVar2);
    pcVar3 = strerror(0x22);
    sVar2 = strlen(local_418);
    strncat(local_418,pcVar3,0x3ff - sVar2);
    sVar2 = strlen(local_418);
    strncat(local_418,"\n",0x3ff - sVar2);
  }
  assertion_make_hardlink
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
             ,L'\x8d',"linkfile","file");
  fprintf(__stream,"linkfile\n");
  wVar1 = is_LargeInode("linkfile");
  if (wVar1 != L'\0') {
    sVar2 = strlen(local_418);
    strncat(local_418,"bsdcpio: linkfile: large inode number truncated: ",0x3ff - sVar2);
    pcVar3 = strerror(0x22);
    sVar2 = strlen(local_418);
    strncat(local_418,pcVar3,0x3ff - sVar2);
    sVar2 = strlen(local_418);
    strncat(local_418,"\n",0x3ff - sVar2);
  }
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
               ,L'\x9d',"symlink","file",L'\0');
    fprintf(__stream,"symlink\n");
    wVar1 = is_LargeInode("symlink");
    if (wVar1 != L'\0') {
      sVar2 = strlen(local_418);
      strncat(local_418,"bsdcpio: symlink: large inode number truncated: ",0x3ff - sVar2);
      pcVar3 = strerror(0x22);
      sVar2 = strlen(local_418);
      strncat(local_418,pcVar3,0x3ff - sVar2);
      sVar2 = strlen(local_418);
      strncat(local_418,"\n",0x3ff - sVar2);
    }
  }
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                      ,L'­',"file2",L'ǿ',L'\xffffffff',"1234567890");
  fprintf(__stream,"file2\n");
  wVar1 = is_LargeInode("file2");
  if (wVar1 != L'\0') {
    sVar2 = strlen(local_418);
    strncat(local_418,"bsdcpio: file2: large inode number truncated: ",0x3ff - sVar2);
    pcVar3 = strerror(0x22);
    sVar2 = strlen(local_418);
    strncat(local_418,pcVar3,0x3ff - sVar2);
    sVar2 = strlen(local_418);
    strncat(local_418,"\n",0x3ff - sVar2);
  }
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                     ,L'¼',"dir",L'ǽ');
  fprintf(__stream,"dir\n");
  wVar1 = is_LargeInode("dir");
  if (wVar1 != L'\0') {
    sVar2 = strlen(local_418);
    strncat(local_418,"bsdcpio: dir: large inode number truncated: ",0x3ff - sVar2);
    pcVar3 = strerror(0x22);
    sVar2 = strlen(local_418);
    strncat(local_418,pcVar3,0x3ff - sVar2);
    sVar2 = strlen(local_418);
    strncat(local_418,"\n",0x3ff - sVar2);
  }
  sVar2 = strlen(local_418);
  strncat(local_418,"2 blocks\n",0x3ff - sVar2);
  fclose(__stream);
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_basic.c"
                  ,L'Î',L'\x12');
  wVar1 = canSymlink();
  pcVar3 = "1 block\n";
  if (wVar1 != L'\0') {
    pcVar3 = "2 blocks\n";
  }
  result._1016_8_ = pcVar3;
  basic_cpio("copy","","",pcVar3,pcVar3);
  basic_cpio("copy_odc","--format=odc","",(char *)result._1016_8_,(char *)result._1016_8_);
  basic_cpio("copy_newc","-H newc","",local_418,"2 blocks\n");
  basic_cpio("copy_cpio","-H odc","",(char *)result._1016_8_,(char *)result._1016_8_);
  result._1016_8_ = (long)"../.\n../file\n1 block\n" + 0xd;
  basic_cpio("copy_bin","-H bin","","1 block\n","1 block\n");
  wVar1 = canSymlink();
  pcVar3 = "8 blocks\n";
  if (wVar1 != L'\0') {
    pcVar3 = "9 blocks\n";
  }
  result._1016_8_ = pcVar3;
  basic_cpio("copy_ustar","-H ustar","",pcVar3,pcVar3);
  passthrough("passthrough");
  return;
}

Assistant:

DEFINE_TEST(test_basic)
{
	FILE *filelist;
	const char *msg;
	char result[1024];

	assertUmask(0);

	/*
	 * Create an assortment of files on disk.
	 */
	filelist = fopen("filelist", "w");
	memset(result, 0, sizeof(result));

	/* File with 10 bytes content. */
	assertMakeFile("file", 0644, "1234567890");
	fprintf(filelist, "file\n");
	if (is_LargeInode("file")) {
		strncat(result,
		    "bsdcpio: file: large inode number truncated: ",
		    sizeof(result) - strlen(result) -1);
		strncat(result,
		    strerror(ERANGE),
		    sizeof(result) - strlen(result) -1);
		strncat(result,
		    "\n",
		    sizeof(result) - strlen(result) -1);
	}

	/* hardlink to above file. */
	assertMakeHardlink("linkfile", "file");
	fprintf(filelist, "linkfile\n");
	if (is_LargeInode("linkfile")) {
		strncat(result,
		    "bsdcpio: linkfile: large inode number truncated: ",
		    sizeof(result) - strlen(result) -1);
		strncat(result,
		    strerror(ERANGE),
		    sizeof(result) - strlen(result) -1);
		strncat(result,
		    "\n",
		    sizeof(result) - strlen(result) -1);
	}

	/* Symlink to above file. */
	if (canSymlink()) {
		assertMakeSymlink("symlink", "file", 0);
		fprintf(filelist, "symlink\n");
		if (is_LargeInode("symlink")) {
			strncat(result,
			    "bsdcpio: symlink: large inode number truncated: ",
			    sizeof(result) - strlen(result) -1);
			strncat(result,
			    strerror(ERANGE),
			    sizeof(result) - strlen(result) -1);
			strncat(result,
			    "\n",
			    sizeof(result) - strlen(result) -1);
		}
	}

	/* Another file with different permissions. */
	assertMakeFile("file2", 0777, "1234567890");
	fprintf(filelist, "file2\n");
	if (is_LargeInode("file2")) {
		strncat(result,
		    "bsdcpio: file2: large inode number truncated: ",
		    sizeof(result) - strlen(result) -1);
		strncat(result,
		    strerror(ERANGE),
		    sizeof(result) - strlen(result) -1);
		strncat(result,
		    "\n",
		    sizeof(result) - strlen(result) -1);
	}

	/* Directory. */
	assertMakeDir("dir", 0775);
	fprintf(filelist, "dir\n");
	if (is_LargeInode("dir")) {
		strncat(result,
		    "bsdcpio: dir: large inode number truncated: ",
		    sizeof(result) - strlen(result) -1);
		strncat(result,
		    strerror(ERANGE),
		    sizeof(result) - strlen(result) -1);
		strncat(result,
		    "\n",
		    sizeof(result) - strlen(result) -1);
	}
	strncat(result, "2 blocks\n", sizeof(result) - strlen(result) -1);

	/* All done. */
	fclose(filelist);

	assertUmask(022);

	/* Archive/dearchive with a variety of options. */
	msg = canSymlink() ? "2 blocks\n" : "1 block\n";
	basic_cpio("copy", "", "", msg, msg);
	basic_cpio("copy_odc", "--format=odc", "", msg, msg);
	basic_cpio("copy_newc", "-H newc", "", result, "2 blocks\n");
	basic_cpio("copy_cpio", "-H odc", "", msg, msg);
	msg = "1 block\n";
	basic_cpio("copy_bin", "-H bin", "", msg, msg);
	msg = canSymlink() ? "9 blocks\n" : "8 blocks\n";
	basic_cpio("copy_ustar", "-H ustar", "", msg, msg);

	/* Copy in one step using -p */
	passthrough("passthrough");
}